

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_reader.cpp
# Opt level: O0

void __thiscall
HttpdBufferedReader_SomeCharactersThenAnError_Test::TestBody
          (HttpdBufferedReader_SomeCharactersThenAnError_Test *this)

{
  bool bVar1;
  MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *pMVar2;
  TypedExpectation<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *pTVar3;
  Message *pMVar4;
  const_reference __in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  char *pcVar5;
  function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *function_impl;
  char *in_R9;
  error_code eVar6;
  AssertHelper local_488;
  Message local_480;
  error_code local_478;
  error_code local_468;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_428;
  Message local_420;
  bool local_411;
  undefined1 local_410 [8];
  AssertionResult gtest_ar__2;
  gets_result_type s2;
  Message local_3c0;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_388;
  Message local_380;
  bool local_371;
  undefined1 local_370 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_350 [8];
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> str1;
  string local_320;
  AssertHelper local_300;
  error_code local_2f8;
  Message local_2e8;
  bool local_2d9;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_;
  gets_result_type s1;
  undefined1 local_270 [8];
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
  br;
  int io;
  WithoutMatchers local_1d1;
  Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&> local_1d0;
  Matcher<int> local_1b8;
  MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  local_1a0;
  allocator local_161;
  string local_160;
  refiller_function local_140;
  type local_120;
  Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  local_100;
  WithoutMatchers local_d9;
  Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&> local_d8;
  Matcher<int> local_b0;
  MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  local_98;
  undefined1 local_60 [8];
  refiller r;
  HttpdBufferedReader_SomeCharactersThenAnError_Test *this_local;
  
  r.gmock12_fill_52.super_UntypedFunctionMockerBase.untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  refiller::refiller((refiller *)local_60);
  testing::Matcher<int>::Matcher(&local_b0,0);
  testing::Matcher<pstore::gsl::span<unsigned_char,-1l>const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::gsl::span<unsigned_char,_1l>const&> *)&local_d8,
             (AnythingMatcher *)&testing::_);
  refiller::gmock_fill(&local_98,(refiller *)local_60,&local_b0,&local_d8);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::
           MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
           ::operator()(&local_98,&local_d9,(void *)0x0);
  pTVar3 = testing::internal::
           MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                      ,0xce,"r","fill (0, _)");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"abc\nd",&local_161);
  yield_string(&local_140,&local_160);
  testing::
  Invoke<std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
            (&local_120,(testing *)&local_140,function_impl);
  testing::
  Action<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>
  ::
  Action<std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>,void>
            ((Action<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>
              *)&local_100,&local_120);
  testing::internal::
  TypedExpectation<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::WillOnce(pTVar3,&local_100);
  testing::
  Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::~Action(&local_100);
  std::
  function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::~function(&local_120);
  std::
  function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::~function(&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  testing::internal::
  MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::~MockSpec(&local_98);
  testing::Matcher<const_pstore::gsl::span<unsigned_char,_-1L>_&>::~Matcher(&local_d8);
  testing::Matcher<int>::~Matcher(&local_b0);
  testing::Matcher<int>::Matcher(&local_1b8,1);
  testing::Matcher<pstore::gsl::span<unsigned_char,-1l>const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::gsl::span<unsigned_char,_1l>const&> *)&local_1d0,
             (AnythingMatcher *)&testing::_);
  refiller::gmock_fill(&local_1a0,(refiller *)local_60,&local_1b8,&local_1d0);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::
           MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
           ::operator()(&local_1a0,&local_1d1,(void *)0x0);
  pcVar5 = "r";
  pTVar3 = testing::internal::
           MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                      ,0xcf,"r","fill (1, _)");
  testing::Invoke<HttpdBufferedReader_SomeCharactersThenAnError_Test::TestBody()::__0>
            ((type *)&br.field_0x6e);
  testing::
  Action<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>
  ::Action<HttpdBufferedReader_SomeCharactersThenAnError_Test::TestBody()::__0,void>
            ((Action<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>
              *)&io,(type *)&br.field_0x6f);
  testing::internal::
  TypedExpectation<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::WillOnce(pTVar3,(Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                     *)&io);
  testing::
  Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::~Action((Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
             *)&io);
  testing::internal::
  MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::~MockSpec(&local_1a0);
  testing::Matcher<const_pstore::gsl::span<unsigned_char,_-1L>_&>::~Matcher(&local_1d0);
  testing::Matcher<int>::~Matcher(&local_1b8);
  br.is_eof_ = false;
  br.push_.valid_ = false;
  br.push_.storage_ = (type)0x0;
  br._107_1_ = 0;
  refiller::refill_function((refiller_function *)&s1.has_error_,(refiller *)local_60);
  pstore::http::
  make_buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
            ((buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
              *)local_270,(http *)&s1.has_error_,
             (function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
              *)0x1000,(size_t)pcVar5);
  std::
  function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::~function((function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
               *)&s1.has_error_);
  pstore::http::
  buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>>
  ::gets_abi_cxx11_((buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
                     *)&gtest_ar_.message_,local_270);
  local_2d9 = pstore::error_or::operator_cast_to_bool((error_or *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d8,&local_2d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pMVar4 = testing::Message::operator<<(&local_2e8,(char (*) [8])"Error: ");
    eVar6 = pstore::
            error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
            ::get_error((error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                         *)&gtest_ar_.message_);
    local_2f8._M_cat = eVar6._M_cat;
    local_2f8._M_value = eVar6._M_value;
    pMVar4 = testing::Message::operator<<(pMVar4,&local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_320,(internal *)local_2d8,(AssertionResult *)"static_cast<bool> (s1)","false",
               "true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
               ,0xd7,pcVar5);
    testing::internal::AssertHelper::operator=(&local_300,pMVar4);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    testing::Message::~Message(&local_2e8);
  }
  str1.storage_._29_3_ = 0;
  str1.storage_.__data[0x1c] = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  if (str1.storage_._28_4_ == 0) {
    pstore::
    maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    maybe((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           *)local_350);
    __in = pstore::
           error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
           ::operator*((error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                        *)&gtest_ar_.message_);
    std::tie<int,pstore::maybe<std::__cxx11::string,void>>
              ((int *)&gtest_ar__1.message_,
               (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                *)&br.is_eof_);
    std::tuple<int&,pstore::maybe<std::__cxx11::string,void>&>::operator=
              ((tuple<int&,pstore::maybe<std::__cxx11::string,void>&> *)&gtest_ar__1.message_,__in);
    local_371 = pstore::
                maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                ::has_value((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                             *)local_350);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_370,&local_371,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
    if (!bVar1) {
      testing::Message::Message(&local_380);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_370,
                 (AssertionResult *)"str1.has_value ()","false","true",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_388,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                 ,0xda,pcVar5);
      testing::internal::AssertHelper::operator=(&local_388,&local_380);
      testing::internal::AssertHelper::~AssertHelper(&local_388);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_380);
    }
    str1.storage_._29_3_ = 0;
    str1.storage_.__data[0x1c] = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
    if (str1.storage_._28_4_ == 0) {
      lhs = pstore::
            maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            ::value((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                     *)local_350);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
                ((EqHelper *)local_3b8,"str1.value ()","\"abc\"",lhs,(char (*) [4])"abc");
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
      if (!bVar1) {
        testing::Message::Message(&local_3c0);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&s2.has_error_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                   ,0xdb,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&s2.has_error_,&local_3c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s2.has_error_);
        testing::Message::~Message(&local_3c0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
      str1.storage_._28_4_ = 0;
    }
    pstore::
    maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    ~maybe((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            *)local_350);
  }
  pstore::
  error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
  ::~error_or((error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
               *)&gtest_ar_.message_);
  if (str1.storage_._28_4_ == 0) {
    pstore::http::
    buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>>
    ::gets_abi_cxx11_((buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
                       *)&gtest_ar__2.message_,local_270);
    local_411 = pstore::error_or::operator_cast_to_bool((error_or *)&gtest_ar__2.message_);
    local_411 = !local_411;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_410,&local_411,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
    if (!bVar1) {
      testing::Message::Message(&local_420);
      pMVar4 = testing::Message::operator<<(&local_420,(char (*) [22])"An error was expected");
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_410,
                 (AssertionResult *)"static_cast<bool> (s2)","true","false",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_428,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                 ,0xdf,pcVar5);
      testing::internal::AssertHelper::operator=(&local_428,pMVar4);
      testing::internal::AssertHelper::~AssertHelper(&local_428);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_420);
    }
    str1.storage_._29_3_ = 0;
    str1.storage_.__data[0x1c] = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
    if (str1.storage_._28_4_ == 0) {
      eVar6 = pstore::
              error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
              ::get_error((error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                           *)&gtest_ar__2.message_);
      local_468._M_cat = eVar6._M_cat;
      local_468._M_value = eVar6._M_value;
      eVar6 = std::make_error_code(operation_not_permitted);
      local_478._M_cat = eVar6._M_cat;
      local_478._M_value = eVar6._M_value;
      testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
                ((EqHelper *)local_458,"s2.get_error ()",
                 "(std::make_error_code (std::errc::operation_not_permitted))",&local_468,&local_478
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
      if (!bVar1) {
        testing::Message::Message(&local_480);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
        testing::internal::AssertHelper::AssertHelper
                  (&local_488,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                   ,0xe0,pcVar5);
        testing::internal::AssertHelper::operator=(&local_488,&local_480);
        testing::internal::AssertHelper::~AssertHelper(&local_488);
        testing::Message::~Message(&local_480);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
      str1.storage_._28_4_ = 0;
    }
    pstore::
    error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
    ::~error_or((error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                 *)&gtest_ar__2.message_);
    if (str1.storage_._28_4_ == 0) {
      str1.storage_._28_4_ = 0;
    }
  }
  pstore::http::
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
  ::~buffered_reader((buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
                      *)local_270);
  refiller::~refiller((refiller *)local_60);
  return;
}

Assistant:

TEST (HttpdBufferedReader, SomeCharactersThenAnError) {
    refiller r;
    EXPECT_CALL (r, fill (0, _)).WillOnce (Invoke (yield_string ("abc\nd")));
    EXPECT_CALL (r, fill (1, _)).WillOnce (Invoke ([] (int, span<std::uint8_t> const &) {
        return refiller_result_type (std::make_error_code (std::errc::operation_not_permitted));
    }));

    auto io = 0;
    auto br = make_buffered_reader<int> (r.refill_function ());
    {
        gets_result_type const s1 = br.gets (io);
        ASSERT_TRUE (static_cast<bool> (s1)) << "Error: " << s1.get_error ();
        maybe<std::string> str1;
        std::tie (io, str1) = *s1;
        ASSERT_TRUE (str1.has_value ());
        EXPECT_EQ (str1.value (), "abc");
    }
    {
        gets_result_type const s2 = br.gets (io);
        ASSERT_FALSE (static_cast<bool> (s2)) << "An error was expected";
        EXPECT_EQ (s2.get_error (), (std::make_error_code (std::errc::operation_not_permitted)));
    }
}